

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O0

char * __thiscall cmGeneratorTarget::GetProperty(cmGeneratorTarget *this,string *prop)

{
  undefined8 uVar1;
  bool bVar2;
  TargetType tgtType;
  cmMessenger *pcVar3;
  cmGeneratorTarget *pcVar4;
  undefined1 local_58 [24];
  char *result;
  undefined1 local_30 [24];
  string *prop_local;
  cmGeneratorTarget *this_local;
  
  local_30._16_8_ = prop;
  prop_local = (string *)this;
  tgtType = GetType(this);
  uVar1 = local_30._16_8_;
  pcVar3 = cmMakefile::GetMessenger(this->Makefile);
  GetBacktrace((cmGeneratorTarget *)local_30);
  bVar2 = cmTargetPropertyComputer::PassesWhitelist
                    (tgtType,(string *)uVar1,pcVar3,(cmListFileBacktrace *)local_30);
  cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)local_30);
  uVar1 = local_30._16_8_;
  if (((bVar2 ^ 0xffU) & 1) == 0) {
    pcVar3 = cmMakefile::GetMessenger(this->Makefile);
    GetBacktrace((cmGeneratorTarget *)local_58);
    pcVar4 = (cmGeneratorTarget *)
             cmTargetPropertyComputer::GetProperty<cmGeneratorTarget>
                       (this,(string *)uVar1,pcVar3,(cmListFileBacktrace *)local_58);
    cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)local_58);
    this_local = pcVar4;
    if (pcVar4 == (cmGeneratorTarget *)0x0) {
      local_58._16_8_ = pcVar4;
      bVar2 = cmSystemTools::GetFatalErrorOccured();
      if (bVar2) {
        this_local = (cmGeneratorTarget *)0x0;
      }
      else {
        this_local = (cmGeneratorTarget *)
                     cmTarget::GetProperty(this->Target,(string *)local_30._16_8_);
      }
    }
  }
  else {
    this_local = (cmGeneratorTarget *)0x0;
  }
  return (char *)this_local;
}

Assistant:

const char* cmGeneratorTarget::GetProperty(const std::string& prop) const
{
  if (!cmTargetPropertyComputer::PassesWhitelist(
        this->GetType(), prop, this->Makefile->GetMessenger(),
        this->GetBacktrace())) {
    return nullptr;
  }
  if (const char* result = cmTargetPropertyComputer::GetProperty(
        this, prop, this->Makefile->GetMessenger(), this->GetBacktrace())) {
    return result;
  }
  if (cmSystemTools::GetFatalErrorOccured()) {
    return nullptr;
  }
  return this->Target->GetProperty(prop);
}